

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall
kj::ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::
ListIterator(ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>
             *this,Maybe<kj::_::XThreadEvent_&> *start)

{
  Maybe<kj::_::XThreadEvent_&> *other;
  Maybe<kj::_::XThreadEvent_&> local_38 [2];
  Maybe<kj::Maybe<kj::_::XThreadEvent_&>_> local_28;
  Maybe<kj::_::XThreadEvent_&> *local_18;
  Maybe<kj::_::XThreadEvent_&> *start_local;
  ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>
  *this_local;
  
  local_18 = start;
  start_local = &this->current;
  Maybe<kj::_::XThreadEvent_&>::Maybe(&this->current,start);
  Maybe<kj::_::XThreadEvent_&>::
  map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_list_h:217:24)>
            ((Maybe<kj::_::XThreadEvent_&> *)&local_28,(anon_class_1_0_00000001 *)start);
  Maybe<kj::_::XThreadEvent_&>::Maybe(local_38);
  other = Maybe<kj::Maybe<kj::_::XThreadEvent_&>_>::orDefault(&local_28,local_38);
  Maybe<kj::_::XThreadEvent_&>::Maybe(&this->next,other);
  Maybe<kj::Maybe<kj::_::XThreadEvent_&>_>::~Maybe(&local_28);
  return;
}

Assistant:

explicit ListIterator(Maybe<MaybeConstT&> start)
      : current(start),
        next(start.map([](MaybeConstT& obj) -> kj::Maybe<MaybeConstT&> { return (obj.*link).next; })
            .orDefault(kj::none)) {}